

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsVertexArrayTests.cpp
# Opt level: O2

char * deqp::gls::RandomArrayGenerator::createPerQuads<deqp::gls::GLValue::WrappedFloatType<float>>
                 (int seed,int count,int componentCount,int stride,Primitive primitive,
                 WrappedFloatType<float> min,WrappedFloatType<float> max)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  Float FVar9;
  deRandom rnd;
  deRandom local_40;
  
  deRandom_init(&local_40,seed);
  iVar5 = componentCount * 4;
  if (stride != 0) {
    iVar5 = stride;
  }
  uVar6 = 0;
  uVar7 = 0;
  uVar1 = iVar5 * 6;
  if (primitive != PRIMITIVE_TRIANGLES) {
    uVar1 = uVar6;
  }
  pcVar3 = (char *)operator_new__((long)(int)(uVar1 * count));
  if (componentCount < 1) {
    componentCount = uVar6;
  }
  if (count < 1) {
    count = uVar6;
  }
  for (; uVar7 != (uint)count; uVar7 = uVar7 + 1) {
    iVar2 = uVar1 * (int)uVar7;
    for (lVar8 = 0; (ulong)(uint)componentCount << 2 != lVar8; lVar8 = lVar8 + 4) {
      FVar9 = getRandom<deqp::gls::GLValue::WrappedFloatType<float>>
                        (&local_40,min.m_value,max.m_value);
      lVar4 = (long)(int)lVar8;
      *(float *)(pcVar3 + lVar4 + iVar2) = FVar9.m_value;
      *(float *)(pcVar3 + lVar4 + (long)iVar5 + (long)iVar2) = FVar9.m_value;
      *(float *)(pcVar3 + lVar4 + (long)(iVar5 * 2) + (long)iVar2) = FVar9.m_value;
      *(float *)(pcVar3 + lVar4 + (long)(iVar5 * 3) + (long)iVar2) = FVar9.m_value;
      *(float *)(pcVar3 + lVar4 + (long)(iVar5 * 4) + (long)iVar2) = FVar9.m_value;
      *(float *)(pcVar3 + lVar4 + (long)(iVar5 * 5) + (long)iVar2) = FVar9.m_value;
    }
  }
  return pcVar3;
}

Assistant:

char* RandomArrayGenerator::createPerQuads (int seed, int count, int componentCount, int stride, Array::Primitive primitive, T min, T max)
{
	deRandom rnd;
	deRandom_init(&rnd, seed);

	int componentStride = sizeof(T);

	if (stride == 0)
		stride = componentStride * componentCount;

	int quadStride = 0;

	switch (primitive)
	{
		case Array::PRIMITIVE_TRIANGLES:
			quadStride = stride * 6;
			break;

		default:
			DE_ASSERT(false);
			break;
	}

	char* data = new char[count * quadStride];

	for (int quadNdx = 0; quadNdx < count; quadNdx++)
	{
		for (int componentNdx = 0; componentNdx < componentCount; componentNdx++)
		{
			T val = getRandom<T>(rnd, min, max);

			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 0 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 1 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 2 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 3 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 4 + componentStride * componentNdx, val);
			alignmentSafeAssignment<T>(data + quadNdx * quadStride + stride * 5 + componentStride * componentNdx, val);
		}
	}

	return data;
}